

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ip4-addr.c
# Opt level: O3

int run_test_ip4_addr(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *loop;
  char *loop_00;
  undefined1 auVar2 [16];
  sockaddr_in addr;
  char dst [16];
  sockaddr_in sStack_28;
  char local_18;
  char cStack_17;
  char cStack_16;
  char cStack_15;
  char cStack_14;
  char cStack_13;
  char cStack_12;
  char cStack_11;
  char cStack_10;
  char cStack_f;
  char cStack_e;
  char cStack_d;
  char cStack_c;
  char cStack_b;
  char cStack_a;
  char cStack_9;
  
  loop_00 = (char *)0x2;
  iVar1 = uv_inet_ntop(2,anon_var_dwarf_3cc77,&local_18,0x10);
  if (iVar1 == 0) {
    auVar2[0] = -(local_18 == '2');
    auVar2[1] = -(cStack_17 == '5');
    auVar2[2] = -(cStack_16 == '5');
    auVar2[3] = -(cStack_15 == '.');
    auVar2[4] = -(cStack_14 == '2');
    auVar2[5] = -(cStack_13 == '5');
    auVar2[6] = -(cStack_12 == '5');
    auVar2[7] = -(cStack_11 == '.');
    auVar2[8] = -(cStack_10 == '2');
    auVar2[9] = -(cStack_f == '5');
    auVar2[10] = -(cStack_e == '5');
    auVar2[0xb] = -(cStack_d == '.');
    auVar2[0xc] = -(cStack_c == '2');
    auVar2[0xd] = -(cStack_b == '5');
    auVar2[0xe] = -(cStack_a == '5');
    auVar2[0xf] = -(cStack_9 == '\0');
    if ((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe | (ushort)(auVar2[0xf] >> 7) << 0xf)
        != 0xffff) goto LAB_0015e495;
    loop_00 = (char *)0x2;
    iVar1 = uv_inet_ntop(2,anon_var_dwarf_3cc77,&local_18,0xf);
    if (iVar1 != -0x1c) goto LAB_0015e49a;
    loop_00 = "127.0.0.1";
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_28);
    if (iVar1 != 0) goto LAB_0015e49f;
    loop_00 = "255.255.255.255";
    iVar1 = uv_ip4_addr("255.255.255.255",0x23a3,&sStack_28);
    if (iVar1 != 0) goto LAB_0015e4a4;
    loop_00 = "255.255.255*000";
    iVar1 = uv_ip4_addr("255.255.255*000",0x23a3,&sStack_28);
    if (iVar1 != -0x16) goto LAB_0015e4a9;
    loop_00 = "255.255.255.256";
    iVar1 = uv_ip4_addr("255.255.255.256",0x23a3,&sStack_28);
    if (iVar1 != -0x16) goto LAB_0015e4ae;
    loop_00 = "2555.0.0.0";
    iVar1 = uv_ip4_addr("2555.0.0.0",0x23a3,&sStack_28);
    if (iVar1 != -0x16) goto LAB_0015e4b3;
    loop_00 = "255";
    iVar1 = uv_ip4_addr("255",0x23a3,&sStack_28);
    if (iVar1 != -0x16) goto LAB_0015e4b8;
    loop_00 = (char *)0x2a;
    iVar1 = uv_inet_pton(0x2a,"127.0.0.1",&sStack_28.sin_addr);
    if (iVar1 == -0x61) {
      loop = uv_default_loop();
      uv_walk(loop,close_walk_cb,(void *)0x0);
      uv_run(loop,UV_RUN_DEFAULT);
      loop_00 = (char *)uv_default_loop();
      iVar1 = uv_loop_close((uv_loop_t *)loop_00);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0015e4c2;
    }
  }
  else {
    run_test_ip4_addr_cold_1();
LAB_0015e495:
    run_test_ip4_addr_cold_2();
LAB_0015e49a:
    run_test_ip4_addr_cold_3();
LAB_0015e49f:
    run_test_ip4_addr_cold_4();
LAB_0015e4a4:
    run_test_ip4_addr_cold_5();
LAB_0015e4a9:
    run_test_ip4_addr_cold_6();
LAB_0015e4ae:
    run_test_ip4_addr_cold_7();
LAB_0015e4b3:
    run_test_ip4_addr_cold_8();
LAB_0015e4b8:
    run_test_ip4_addr_cold_9();
  }
  run_test_ip4_addr_cold_10();
LAB_0015e4c2:
  run_test_ip4_addr_cold_11();
  iVar1 = uv_is_closing((uv_handle_t *)loop_00);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)loop_00,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(ip4_addr) {
  struct sockaddr_in addr;
  char dst[16];

  ASSERT(0 == uv_inet_ntop(AF_INET, "\xFF\xFF\xFF\xFF", dst, sizeof(dst)));
  ASSERT(0 == strcmp(dst, "255.255.255.255"));
  ASSERT(UV_ENOSPC == uv_inet_ntop(AF_INET, "\xFF\xFF\xFF\xFF",
                                   dst, sizeof(dst) - 1));

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  ASSERT(0 == uv_ip4_addr("255.255.255.255", TEST_PORT, &addr));
  ASSERT(UV_EINVAL == uv_ip4_addr("255.255.255*000", TEST_PORT, &addr));
  ASSERT(UV_EINVAL == uv_ip4_addr("255.255.255.256", TEST_PORT, &addr));
  ASSERT(UV_EINVAL == uv_ip4_addr("2555.0.0.0", TEST_PORT, &addr));
  ASSERT(UV_EINVAL == uv_ip4_addr("255", TEST_PORT, &addr));

#ifdef SIN6_LEN
  ASSERT(addr.sin_len == sizeof(addr));
#endif

  /* for broken address family */
  ASSERT(UV_EAFNOSUPPORT == uv_inet_pton(42, "127.0.0.1",
    &addr.sin_addr.s_addr));

  MAKE_VALGRIND_HAPPY();
  return 0;
}